

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::HasExtraArrayness
          (InterfaceVariableScalarReplacement *this,Instruction *entry_point,Instruction *var)

{
  IRContext *this_00;
  DecorationManager *this_01;
  bool bVar1;
  uint32_t uVar2;
  uint32_t id;
  
  uVar2 = (entry_point->has_result_id_ & 1) + 1;
  if (entry_point->has_type_id_ == false) {
    uVar2 = (uint)entry_point->has_result_id_;
  }
  uVar2 = Instruction::GetSingleWordOperand(entry_point,uVar2);
  if (0xfffffffd < uVar2 - 3) {
    this_00 = (this->super_Pass).context_;
    if ((this_00->valid_analyses_ & kAnalysisDecorations) == kAnalysisNone) {
      IRContext::BuildDecorationManager(this_00);
    }
    this_01 = (this_00->decoration_mgr_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
              .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>.
              _M_head_impl;
    id = 0;
    if (var->has_result_id_ == true) {
      id = Instruction::GetSingleWordOperand(var,(uint)var->has_type_id_);
    }
    bVar1 = analysis::DecorationManager::HasDecoration(this_01,id,0xf);
    if (!bVar1) {
      if (uVar2 == 1) {
        return true;
      }
      uVar2 = (var->has_result_id_ & 1) + 1;
      if (var->has_type_id_ == false) {
        uVar2 = (uint)var->has_result_id_;
      }
      uVar2 = Instruction::GetSingleWordOperand(var,uVar2);
      return uVar2 != 3;
    }
  }
  return false;
}

Assistant:

bool InterfaceVariableScalarReplacement::HasExtraArrayness(
    Instruction& entry_point, Instruction* var) {
  spv::ExecutionModel execution_model =
      static_cast<spv::ExecutionModel>(entry_point.GetSingleWordInOperand(0));
  if (execution_model != spv::ExecutionModel::TessellationEvaluation &&
      execution_model != spv::ExecutionModel::TessellationControl) {
    return false;
  }
  if (!context()->get_decoration_mgr()->HasDecoration(
          var->result_id(), uint32_t(spv::Decoration::Patch))) {
    if (execution_model == spv::ExecutionModel::TessellationControl)
      return true;
    return GetStorageClass(var) != spv::StorageClass::Output;
  }
  return false;
}